

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O3

wchar_t borg_attack_aux_rod_bolt(wchar_t sval,wchar_t rad,wchar_t dam,wchar_t typ)

{
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  
  wVar3 = L'\0';
  wVar4 = L'\0';
  if (((borg.trait[0x70] == 0) && (wVar4 = wVar3, borg.trait[0x72] == 0)) && (borg.trait[0x78] == 0)
     ) {
    if ((borg_simulate) && (uVar2 = Rand_div(100), (int)uVar2 < 2)) {
      return L'\0';
    }
    wVar3 = borg_activate_failure(L'\x18',sval);
    if (((wVar3 < L'ǵ') && (_Var1 = borg_equips_rod(sval), _Var1)) &&
       (wVar4 = borg_launch_bolt(rad,dam,typ,(uint)z_info->max_range,L'\0'), borg_simulate == false)
       ) {
      borg_zap_rod(sval);
      borg_keypress(0x35);
      successful_target = L'\xffffffff';
    }
  }
  return wVar4;
}

Assistant:

static int borg_attack_aux_rod_bolt(int sval, int rad, int dam, int typ)
{
    int b_n;

    /* No firing while blind, confused, or hallucinating */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED]
        || borg.trait[BI_ISIMAGE])
        return 0;

    /* Paranoia */
    if (borg_simulate && (randint0(100) < 2))
        return 0;

    /* Not likely to be successful in the activation */
    if (500 < borg_activate_failure(TV_ROD, sval))
        return 0;

    /* Look for that rod */
    if (!borg_equips_rod(sval))
        return 0;

    /* Choose optimal location */
    b_n = borg_launch_bolt(rad, dam, typ, z_info->max_range, 0);

    /* Simulation */
    if (borg_simulate)
        return b_n;

    /* Zap the rod */
    (void)borg_zap_rod(sval);

    /* Use target */
    borg_keypress('5');

    /* Set our shooting flag */
    successful_target = -1;

    /* Value */
    return b_n;
}